

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

token_t * get_token(void)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 uVar11;
  ushort **ppuVar12;
  ushort *puVar13;
  char *pcVar14;
  char *pcVar15;
  size_t sVar16;
  char cVar17;
  char *pcVar18;
  byte *pbVar19;
  uint uVar20;
  int bc;
  int iVar21;
  int *piVar22;
  int bl;
  undefined8 local_440;
  byte local_438 [1032];
  
  do {
    readbyte();
    ppuVar12 = __ctype_b_loc();
    iVar10 = c;
    while( true ) {
      bVar1 = *(byte *)((long)*ppuVar12 + (long)iVar10 * 2 + 1);
      uVar20 = line;
      uVar5 = column;
      while (line = uVar20, column = uVar5, (bVar1 & 0x20) != 0) {
        readbyte();
        uVar20 = line;
        uVar5 = column;
        iVar10 = c;
        bVar1 = *(byte *)((long)*ppuVar12 + (long)c * 2 + 1);
      }
      eline = uVar20;
      ecolumn = uVar5;
      if ((iVar10 != 0x2f) || ((l != 0x2f && (l != 0x2a)))) break;
      readbyte();
      if (c == 0x2a) {
        do {
          readbyte();
          if (c == -1) {
            err(E,"unterminated comment");
            break;
          }
        } while ((c != 0x2a) || (l != 0x2f));
        readbyte();
        readbyte();
        iVar10 = c;
      }
      else {
        do {
          readbyte();
        } while (c != 10);
        iVar10 = 10;
      }
    }
    t.id = iVar10;
    t.line = uVar20;
    t.column = uVar5;
    if ((iVar10 == 0x23) && (prev == 10)) {
      puVar13 = *ppuVar12;
      if ((*(byte *)((long)puVar13 + (long)l * 2 + 1) & 0x20) != 0) {
        pcVar14 = pp_get_token();
        uVar20 = line;
        if (pcVar14 == (char *)0x0) goto LAB_00104bb8;
        cVar17 = *pcVar14;
        if (cVar17 == '\0') goto LAB_001046cf;
        pcVar18 = pcVar14;
        goto LAB_001046b7;
      }
    }
    else {
      if (iVar10 == -1) goto switchD_001044ce_caseD_25;
      puVar13 = *ppuVar12;
    }
    if ((iVar10 == 0x5f) || ((puVar13[iVar10] & 0x400) != 0)) {
      t.id = 0x86;
      t.string[0] = (char)iVar10;
      if (((long)l == 0x5f) || (((*ppuVar12)[l] & 8) != 0)) {
        pcVar14 = t.string + 1;
        iVar10 = 1;
        do {
          readbyte();
          if (iVar10 < 0x1f) {
            *pcVar14 = (byte)c;
            pcVar14 = pcVar14 + 1;
            iVar10 = iVar10 + 1;
          }
        } while (((long)l == 0x5f) || (((*ppuVar12)[l] & 8) != 0));
        *pcVar14 = '\0';
        if (0x1e < iVar10) {
          err(W,"too long identifier has been truncated to %d characters.",0x1f);
        }
      }
      else {
        t.string[1] = '\0';
      }
      if (t.string[4] == '\0' &&
          CONCAT13(t.string[3],CONCAT12(t.string[2],CONCAT11(t.string[1],t.string[0]))) ==
          0x65747962) {
        t.id = 0x80;
      }
      else if (CONCAT22(t.string._5_2_,CONCAT11(t.string[4],t.string[3])) == 0x6e7275 &&
               CONCAT13(t.string[3],CONCAT12(t.string[2],CONCAT11(t.string[1],t.string[0]))) ==
               0x75746572) {
        t.id = 0x83;
      }
      else if (t.string[4] == '\0' &&
               CONCAT13(t.string[3],CONCAT12(t.string[2],CONCAT11(t.string[1],t.string[0]))) ==
               0x64696f76) {
        t.id = 0x84;
      }
      else if (t.string[4] == '\0' &&
               CONCAT13(t.string[3],CONCAT12(t.string[2],CONCAT11(t.string[1],t.string[0]))) ==
               0x64726f77) {
        t.id = 0x85;
      }
      goto switchD_001044ce_caseD_25;
    }
    if ((puVar13[iVar10] >> 0xb & 1) != 0) {
      t.id = 0x87;
      t._unsigned = 0;
      t._word = 0;
      if (iVar10 == 0x30) {
        t.constant = 0;
        iVar10 = 8;
        if ((l & 0xffffffdfU) == 0x58) {
          local_440 = ftell((FILE *)f);
          readbyte();
          iVar10 = 0x10;
          if ((((*ppuVar12)[l] >> 0xb & 1) == 0) &&
             ((0x25 < l - 0x41U || ((0x3f0000003fU >> ((ulong)(l - 0x41U) & 0x3f) & 1) == 0)))) {
            fseek((FILE *)f,local_440,0);
            l = c;
            line = uVar20;
            column = uVar5;
          }
        }
      }
      else {
        t.constant = iVar10 - 0x30;
        iVar10 = 10;
      }
      local_440 = local_440 & 0xffffffff00000000;
      bVar6 = false;
      goto LAB_0010489b;
    }
    switch(iVar10) {
    case 0x21:
      goto switchD_001044ce_caseD_21;
    case 0x25:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2f:
    case 0x3b:
      goto switchD_001044ce_caseD_25;
    case 0x3c:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x8a;
      }
      goto switchD_001044ce_caseD_25;
    case 0x3d:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x88;
      }
      goto switchD_001044ce_caseD_25;
    case 0x3e:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x8b;
      }
      goto switchD_001044ce_caseD_25;
    default:
      if ((iVar10 - 0x5bU < 0x23) && ((0x500000005U >> ((ulong)(iVar10 - 0x5bU) & 0x3f) & 1) != 0))
      goto switchD_001044ce_caseD_25;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
      pcVar14 = "stray \"%c\" in program";
      if (iVar10 - 0x7fU < 0xffffffa1) {
        pcVar14 = "stray \'%o\' in program";
      }
      err(E,pcVar14);
    }
  } while( true );
LAB_00104772:
  while ((l != -1 && (l != 10))) {
    readbyte();
  }
  err(E,"invalid line number \"%s\"",pcVar14);
  uVar20 = line;
  goto LAB_00104bb8;
switchD_001044ce_caseD_21:
  if (l == 0x3d) {
    readbyte();
    t.id = 0x89;
  }
  goto switchD_001044ce_caseD_25;
LAB_0010489b:
  uVar2 = (*ppuVar12)[l];
  if (iVar10 == 0x10) {
    iVar21 = -0x30;
    if ((((uVar2 >> 0xb & 1) == 0) && (iVar21 = -0x57, 5 < l - 0x61U)) &&
       (iVar21 = -0x37, 5 < l - 0x41U)) goto LAB_0010499f;
LAB_001048ee:
    readbyte();
    iVar21 = iVar21 + c;
    if (iVar21 == -1) goto LAB_0010499f;
  }
  else {
    if (iVar10 == 10) {
      iVar21 = -0x30;
      if ((uVar2 >> 0xb & 1) != 0) goto LAB_001048ee;
      goto LAB_0010499f;
    }
    if ((uVar2 >> 0xb & 1) == 0) goto LAB_0010499f;
    readbyte();
    iVar7 = ecolumn;
    iVar21 = eline;
    if ((c & 0xfffffff8U) != 0x30) {
      err(E,"invalid digit \"%c\" in octal constant",(ulong)(uint)c);
      eline = iVar21;
      ecolumn = iVar7;
LAB_0010499f:
      if (((long)l == 0x5f) || (((*ppuVar12)[l] & 0x400) != 0)) {
        readbyte();
        pbVar19 = local_438 + 1;
        local_438[0] = (byte)c;
        if (((*ppuVar12)[l] & 8) == 0) {
          pcVar14 = "";
        }
        else {
          iVar10 = 1;
          do {
            readbyte();
            if (iVar10 < 8) {
              *pbVar19 = (byte)c;
              pbVar19 = pbVar19 + 1;
              iVar10 = iVar10 + 1;
            }
          } while (((*ppuVar12)[l] & 8) != 0);
          pcVar14 = "";
          if (iVar10 == 8) {
            pcVar14 = "...";
          }
        }
        *pbVar19 = 0;
        bVar3 = false;
        pbVar19 = local_438;
        bVar4 = false;
        do {
          bVar1 = *pbVar19;
          if (bVar1 < 0x75) {
            if (bVar1 != 0x55) {
              if (bVar1 != 0) goto LAB_00104ad1;
              break;
            }
LAB_00104aba:
            piVar22 = &t._unsigned;
            bVar8 = true;
            bVar9 = bVar4;
            if (bVar3) goto LAB_00104af1;
          }
          else {
            if (bVar1 != 0x77) {
              if (bVar1 == 0x75) goto LAB_00104aba;
LAB_00104ad1:
              if (bVar1 != 0x57) goto LAB_00104af1;
            }
            piVar22 = &t._word;
            bVar8 = bVar3;
            bVar9 = true;
            if (bVar4) goto LAB_00104af1;
          }
          bVar4 = bVar9;
          bVar3 = bVar8;
          *piVar22 = 1;
          pbVar19 = pbVar19 + 1;
        } while( true );
      }
      if (t._word == 0) {
        if (0x7f < t.constant && t._unsigned == 0) {
          t._unsigned = 1;
          t._word = 0;
        }
        if (!bVar6) goto switchD_001044ce_caseD_25;
        t.constant = t.constant & 0xff;
      }
      else {
        if (0x7fff < t.constant && t._unsigned == 0) {
          t._unsigned = 1;
        }
        if ((int)local_440 == 0) goto switchD_001044ce_caseD_25;
        t.constant = t.constant & 0xffff;
      }
      t._unsigned = 1;
      err(W,"numeric constant is too large for its type");
      goto switchD_001044ce_caseD_25;
    }
    iVar21 = c + -0x30;
  }
  t.constant = t.constant * iVar10 + iVar21;
  if (0xff < t.constant) {
    bVar6 = true;
  }
  uVar11 = (int)local_440;
  if (0xffff < t.constant) {
    uVar11 = 1;
  }
  local_440 = CONCAT44(local_440._4_4_,uVar11);
  goto LAB_0010489b;
LAB_00104af1:
  err(E,"invalid suffix \"%s%s\" after integer constant",local_438,pcVar14);
  goto switchD_001044ce_caseD_25;
  while (cVar17 = *pcVar18, cVar17 != '\0') {
LAB_001046b7:
    pcVar18 = pcVar18 + 1;
    if ((*(byte *)((long)*ppuVar12 + (long)cVar17 * 2 + 1) & 8) == 0) goto LAB_00104772;
  }
LAB_001046cf:
  iVar10 = atoi(pcVar14);
  uVar20 = iVar10 - 1;
  pcVar18 = pp_get_token();
  pcVar14 = pcVar18;
  if (pcVar18 != (char *)0x0) {
    do {
      pcVar15 = pcVar14;
      pcVar14 = pcVar15 + 1;
    } while (*pcVar15 != '\0');
    if ((*pcVar18 == '\"') && (pcVar15[-1] == '\"')) {
      strcpy((char *)local_438,pcVar18 + 1);
      sVar16 = strlen(pcVar18 + 1);
      local_438[sVar16 - 1] = 0;
      pcVar14 = pp_get_token();
      if (pcVar14 == (char *)0x0) {
        esetfile((char *)local_438);
      }
      else {
        err(E,"unexpected flag \"%s\" in line directive",pcVar14);
        while ((l != -1 && (l != 10))) {
          readbyte();
        }
        line = uVar20;
        esetfile((char *)local_438);
        uVar20 = line;
      }
    }
    else {
      err(E,"\"%s\" is not a valid filename",pcVar18);
      while ((l != -1 && (l != 10))) {
        readbyte();
      }
    }
  }
LAB_00104bb8:
  line = uVar20;
  get_token();
switchD_001044ce_caseD_25:
  return &t;
}

Assistant:

token_t* get_token()
{
    int skip = '1';

    readbyte();

    while (skip)
    {
        while (isspace(c))
            readbyte();

        if (c == '/' && (l == '*' || l == '/'))
        {
            eline = line;
            ecolumn = column;

            readbyte();
            if (c == '*')
            {
                do
                {
                    readbyte();
                    if (c == EOF)
                    {
                        err(E, "unterminated comment");
                        break;
                    }
                } while (!(c == '*' && l == '/'));
                readbyte();
                readbyte();
            }
            else
            {
                do
                {
                    readbyte();
                } while (c != '\n');
            }
        }
        else
            skip = 0;
    }

    eline = line;
    ecolumn = column;

    t.id = c;
    t.line = line;
    t.column = column;

    if (c == '#' && prev == '\n' && isspace(l))
    {
        parse_pp_info();
        return get_token();
    }

    if (c == EOF)
    {
    }
    else if (isalpha(c) || c == '_')
    {
        char* p = t.string;
        int len = 1;
        t.id = IDENTIFIER;

        *p++ = c;
        while (isalnum(l) || l == '_')
        {
            readbyte();
            if (len < MAX_ID_LEN)
            {
                *p++ = c;
                ++len;
            }
        }
        *p = 0;

        if (len >= MAX_ID_LEN)
        {
            err(W, "too long identifier has been truncated to %d characters.",
                 MAX_ID_LEN);
        }

        if (strcmp(t.string, "byte") == 0)
            t.id = BYTE;
        else if (strcmp(t.string, "return") == 0)
            t.id = RETURN;
        else if (strcmp(t.string, "void") == 0)
            t.id = VOID;
        else if (strcmp(t.string, "word") == 0)
            t.id = WORD;
    }
    else if (isdigit(c))
    {
        t.id = CONSTANT;
        t._unsigned = 0;
        t._word = 0;
        parse_num();
    }
    else if ( c == '>')
    {
        if (l == '=')
        {
            readbyte();
            t.id = GE_OP;
        }
    }
    else if (c == '<')
    {
        if (l == '=')
        {
            readbyte();
            t.id = LE_OP;
        }
    }
    else if (c == '!')
    {
        if (l == '=')
        {
            readbyte();
            t.id = NE_OP;
        }
    }
    else if (c == '=')
    {
        if (l == '=')
        {
            readbyte();
            t.id = EQ_OP;
        }
    }
    else if (c == '-')
    {
    }
    else if (c == '+')
    {
    }
    else if (c == '*')
    {
    }
    else if (c == '/')
    {
    }
    else if (c == '%')
    {
    }
    else if (   c == '(' || c == ')'
             || c == '{' || c == '}'
             || c == '[' || c == ']'
             || c == ';' || c == ',')
    {
    }
    else
    {
        if (c < ' ' || c >= 127)
            err(E, "stray '%o' in program", c);
        else
            err(E, "stray \"%c\" in program", c);
        return get_token();
    }

    return &t;
}